

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void __thiscall asio::detail::thread_info_base::rethrow_pending_exception(thread_info_base *this)

{
  undefined8 uVar1;
  exception_ptr ex;
  long local_18;
  long local_10;
  
  if (*(int *)(this[2].reusable_memory_ + 2) < 1) {
    return;
  }
  *(undefined4 *)(this[2].reusable_memory_ + 2) = 0;
  local_18 = *(long *)&this[2].has_pending_exception_;
  *(undefined8 *)&this[2].has_pending_exception_ = 0;
  local_10 = local_18;
  if (local_18 != 0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar1 = std::rethrow_exception((exception_ptr)&local_18);
  if (local_18 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_10 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void rethrow_pending_exception()
  {
#if !defined(ASIO_NO_EXCEPTIONS)
    if (has_pending_exception_ > 0)
    {
      has_pending_exception_ = 0;
      std::exception_ptr ex(
          static_cast<std::exception_ptr&&>(
            pending_exception_));
      std::rethrow_exception(ex);
    }
#endif // !defined(ASIO_NO_EXCEPTIONS)
  }